

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

bool bssl::anon_unknown_0::CompleteHandshakes(SSL *client,SSL *server)

{
  char cVar1;
  int ret_code;
  uint uVar2;
  int ret_code_00;
  
  do {
    ret_code = SSL_do_handshake((SSL *)client);
    uVar2 = SSL_get_error((SSL *)client,ret_code);
    if ((uVar2 < 0xf) && ((0x400dU >> (uVar2 & 0x1f) & 1) != 0)) {
      ret_code_00 = SSL_do_handshake((SSL *)server);
      uVar2 = SSL_get_error((SSL *)server,ret_code_00);
      if ((0xe < uVar2) || ((0x400dU >> (uVar2 & 0x1f) & 1) == 0)) {
        _GLOBAL__N_1::CompleteHandshakes((_GLOBAL__N_1 *)(ulong)uVar2);
        goto LAB_00169581;
      }
      cVar1 = (ret_code_00 == 1 && ret_code == 1) * '\x02';
    }
    else {
      _GLOBAL__N_1::CompleteHandshakes((_GLOBAL__N_1 *)(ulong)uVar2);
LAB_00169581:
      cVar1 = '\x01';
    }
    if (cVar1 != '\0') {
      return cVar1 != '\x01';
    }
  } while( true );
}

Assistant:

static bool CompleteHandshakes(SSL *client, SSL *server) {
  // Drive both their handshakes to completion.
  for (;;) {
    int client_ret = SSL_do_handshake(client);
    int client_err = SSL_get_error(client, client_ret);
    if (client_err != SSL_ERROR_NONE &&        //
        client_err != SSL_ERROR_WANT_READ &&   //
        client_err != SSL_ERROR_WANT_WRITE &&  //
        client_err != SSL_ERROR_PENDING_TICKET) {
      fprintf(stderr, "Client error: %s\n", SSL_error_description(client_err));
      return false;
    }

    int server_ret = SSL_do_handshake(server);
    int server_err = SSL_get_error(server, server_ret);
    if (server_err != SSL_ERROR_NONE &&        //
        server_err != SSL_ERROR_WANT_READ &&   //
        server_err != SSL_ERROR_WANT_WRITE &&  //
        server_err != SSL_ERROR_PENDING_TICKET) {
      fprintf(stderr, "Server error: %s\n", SSL_error_description(server_err));
      return false;
    }

    if (client_ret == 1 && server_ret == 1) {
      break;
    }
  }

  return true;
}